

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<float>::SolveSOR
          (TPZMatrix<float> *this,int64_t *numiterations,TPZFMatrix<float> *F,
          TPZFMatrix<float> *result,TPZFMatrix<float> *residual,TPZFMatrix<float> *param_6,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  bool bVar1;
  long lVar2;
  int64_t iVar3;
  float *pfVar4;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  long *in_RDI;
  TPZBaseMatrix *in_R8;
  float extraout_XMM0_Da;
  float fVar5;
  float fVar6;
  float fVar7;
  double in_XMM0_Qa;
  double dVar8;
  double *in_stack_00000008;
  int in_stack_00000010;
  int64_t j;
  int64_t ic;
  float eqres;
  int64_t it;
  int64_t iinc;
  int64_t ilast;
  int64_t ifirst;
  int64_t i;
  int64_t c;
  int64_t r;
  float res;
  long col;
  long row;
  undefined4 in_stack_ffffffffffffff80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  float local_3c;
  
  if (in_R8 == in_RDX) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  }
  else {
    local_3c = (float)*in_stack_00000008 + (float)*in_stack_00000008 + 1.0;
    if (in_R8 != (TPZBaseMatrix *)0x0) {
      local_3c = ::Norm((TPZFMatrix<float> *)0x12fc695);
    }
    if (in_stack_00000010 == 0) {
      (**(code **)(*in_RCX + 0x78))();
    }
    lVar2 = (**(code **)(*in_RDI + 0x60))();
    iVar3 = TPZBaseMatrix::Cols(in_RDX);
    local_60 = 0;
    local_70 = 1;
    local_68 = lVar2;
    if ((int)j == -1) {
      local_60 = lVar2 + -1;
      local_68 = -1;
      local_70 = -1;
    }
    local_78 = 0;
    while( true ) {
      bVar1 = false;
      if (local_78 < *in_RSI) {
        dVar8 = std::fabs((double)(ulong)(uint)local_3c);
        bVar1 = (double)((ulong)*in_stack_00000008 & (ulong)DAT_0203e3c0) < (double)SUB84(dVar8,0);
      }
      if (!bVar1) break;
      local_3c = 0.0;
      for (row = 0; row < iVar3; row = row + 1) {
        for (local_58 = local_60; local_58 != local_68; local_58 = local_70 + local_58) {
          (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDX,local_58,row);
          fVar6 = extraout_XMM0_Da;
          for (col = 0; col < lVar2; col = col + 1) {
            fVar5 = (float)(**(code **)(*in_RDI + 0x120))(in_RDI,local_58,col);
            pfVar4 = TPZFMatrix<float>::operator()
                               ((TPZFMatrix<float> *)CONCAT44(fVar6,in_stack_ffffffffffffff80),row,
                                col);
            fVar6 = -fVar5 * *pfVar4 + fVar6;
          }
          local_3c = fVar6 * fVar6 + local_3c;
          fVar5 = (float)in_XMM0_Qa * fVar6;
          fVar7 = (float)(**(code **)(*in_RDI + 0x120))(in_RDI,local_58,local_58);
          pfVar4 = TPZFMatrix<float>::operator()
                             ((TPZFMatrix<float> *)CONCAT44(fVar6,in_stack_ffffffffffffff80),row,col
                             );
          *pfVar4 = fVar5 / fVar7 + *pfVar4;
        }
      }
      dVar8 = std::sqrt((double)(ulong)(uint)local_3c);
      local_3c = SUB84(dVar8,0);
      local_78 = local_78 + 1;
    }
    if (in_R8 != (TPZBaseMatrix *)0x0) {
      (**(code **)(*in_RDI + 0x140))(in_RDI,in_RCX,in_RDX,in_R8);
    }
    *in_RSI = local_78;
    dVar8 = std::fabs((double)(ulong)(uint)local_3c);
    *in_stack_00000008 = (double)SUB84(dVar8,0);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}